

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_xfrm.c
# Opt level: O3

void easm_substpos_expr(easm_expr *expr,uint64_t val)

{
  if (expr->e1 != (easm_expr *)0x0) {
    easm_substpos_expr(expr->e1,val);
  }
  if (expr->e2 != (easm_expr *)0x0) {
    easm_substpos_expr(expr->e2,val);
  }
  if (expr->sinsn != (easm_sinsn *)0x0) {
    easm_substpos_sinsn(expr->sinsn,val);
  }
  if (expr->type == EASM_EXPR_POS) {
    expr->type = EASM_EXPR_NUM;
    expr->num = val;
  }
  return;
}

Assistant:

void easm_substpos_expr(struct easm_expr *expr, uint64_t val) {
	if (expr->e1)
		easm_substpos_expr(expr->e1, val);
	if (expr->e2)
		easm_substpos_expr(expr->e2, val);
	if (expr->sinsn)
		easm_substpos_sinsn(expr->sinsn, val);
	if (expr->type == EASM_EXPR_POS) {
		expr->type = EASM_EXPR_NUM;
		expr->num = val;
	}
}